

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,WhileStatement *statement)

{
  int *piVar1;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *this_00;
  int iVar2;
  ulong in_RAX;
  Value *pVVar3;
  _Elt_pointer piVar4;
  undefined8 local_38;
  
  piVar1 = &this->current_layer_->traverse_index;
  *piVar1 = *piVar1 + 1;
  this_00 = &this->offsets_;
  local_38 = in_RAX;
  while( true ) {
    pVVar3 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&statement->expression_->super_Node);
    iVar2 = (*pVVar3->_vptr_Value[2])(pVVar3);
    if (iVar2 == 0) break;
    this->current_layer_ =
         (this->current_layer_->children_).
         super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
         super__Vector_impl_data._M_start[(long)this->current_layer_->traverse_index + -1];
    local_38 = local_38 & 0xffffffff00000000;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&local_38);
    FrameEmulator::AllocScope(&this->frame_);
    FunctionTable::BeginScope(&this->table_);
    (**(statement->statement_->super_Node)._vptr_Node)(statement->statement_,this);
    std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
    this->current_layer_ = this->current_layer_->parent_;
    FrameEmulator::DeallocScope(&this->frame_);
    FunctionTable::EndScope(&this->table_);
  }
  piVar4 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar4 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar4 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  iVar2 = piVar4[-1];
  std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
  local_38 = CONCAT44(iVar2 + 1,(int)local_38);
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)((long)&local_38 + 4))
  ;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(WhileStatement* statement) {
  ++current_layer_->traverse_index;
  while (Accept(statement->expression_)->GetValue()) {
    current_layer_ =
        current_layer_->children_[current_layer_->traverse_index - 1];

    offsets_.push(0);
    frame_.AllocScope();
    table_.BeginScope();

    statement->statement_->Accept(this);

    offsets_.pop();
    current_layer_ = current_layer_->parent_;
    frame_.DeallocScope();
    table_.EndScope();
  }
  size_t index = offsets_.top();
  offsets_.pop();
  offsets_.push(index + 1);
}